

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest4::iterate(NegativeTest4 *this)

{
  bool bVar1;
  int iVar2;
  GLint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar6;
  _shader_stage *shader_stage_00;
  _shader_stage local_264;
  string local_260;
  MessageBuilder local_240;
  _test_case local_c0;
  _shader_stage local_bc;
  string local_b8;
  int local_94;
  undefined8 uStack_90;
  GLint compile_status;
  char *body_raw_ptr;
  string body;
  uint local_60;
  int test_case;
  uint n_subroutine_types;
  _shader_stage local_54;
  GLenum shader_type;
  int shader_stage;
  allocator<char> local_39;
  string local_38;
  long local_18;
  Functions *gl;
  NegativeTest4 *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    shader_type._3_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_shader_subroutine is not supported.",&local_39);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
    shader_type._3_1_ = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  for (local_54 = SHADER_STAGE_FIRST; local_54 != SHADER_STAGE_COUNT;
      local_54 = local_54 + SHADER_STAGE_TESSELLATION_CONTROL) {
    test_case = local_54;
    n_subroutine_types = Utils::getGLenumForShaderStage((_shader_stage *)&test_case);
    for (local_60 = 1; local_60 < 6; local_60 = local_60 + 1) {
      for (body.field_2._12_4_ = 0; body.field_2._12_4_ != 2;
          body.field_2._12_4_ = body.field_2._12_4_ + 1) {
        std::__cxx11::string::string((string *)&body_raw_ptr);
        uStack_90 = 0;
        local_94 = 0;
        local_bc = local_54;
        local_c0 = body.field_2._12_4_;
        getShaderBody_abi_cxx11_(&local_b8,this,&local_bc,&local_60,&local_c0);
        std::__cxx11::string::operator=((string *)&body_raw_ptr,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        uStack_90 = std::__cxx11::string::c_str();
        GVar3 = (**(code **)(local_18 + 0x3f0))(n_subroutine_types);
        this->m_so_id = GVar3;
        dVar4 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar4,"glCreateShader() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x2eba);
        (**(code **)(local_18 + 0x12b8))(this->m_so_id,1,&stack0xffffffffffffff70,0);
        dVar4 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar4,"glShaderSource() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x2ebd);
        (**(code **)(local_18 + 0x248))(this->m_so_id);
        dVar4 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar4,"glCompileShader() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x2ec0);
        (**(code **)(local_18 + 0xa70))(this->m_so_id,0x8b81,&local_94);
        dVar4 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar4,"glGetShaderiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x2ec3);
        if (local_94 == 1) {
          this_02 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_240,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<(&local_240,(char (*) [13])"A malformed ");
          local_264 = local_54;
          Utils::getShaderStageString_abi_cxx11_(&local_260,(Utils *)&local_264,shader_stage_00);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_260);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [25])" compiled successfully (")
          ;
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_60);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,(char (*) [33])" subroutine types were defined).");
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_260);
          tcu::MessageBuilder::~MessageBuilder(&local_240);
          this->m_has_test_passed = false;
        }
        (**(code **)(local_18 + 0x470))(this->m_so_id);
        dVar4 = (**(code **)(local_18 + 0x800))();
        glu::checkError(dVar4,"glDeleteShader() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x2ed4);
        std::__cxx11::string::~string((string *)&body_raw_ptr);
      }
    }
  }
  if ((this->m_has_test_passed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult NegativeTest4::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all shader stages.. */
	for (int shader_stage = static_cast<int>(Utils::SHADER_STAGE_FIRST);
		 shader_stage != static_cast<int>(Utils::SHADER_STAGE_COUNT); ++shader_stage)
	{
		/* For each shader stage, we will be trying to compile a number of invalid shaders.
		 * Each shader defines N different subroutine types. (N-1) of them are compatible
		 * with a subroutine, but exactly 1 will be mismatched. The test passes if GLSL
		 * compiler correctly detects that all shaders we will be trying to compile are
		 * broken.
		 */
		const glw::GLenum shader_type = Utils::getGLenumForShaderStage(static_cast<Utils::_shader_stage>(shader_stage));

		for (unsigned int n_subroutine_types = 1; n_subroutine_types < 6; /* arbitrary number */
			 ++n_subroutine_types)
		{
			for (int test_case = static_cast<int>(TEST_CASE_FIRST); test_case != static_cast<int>(TEST_CASE_COUNT);
				 ++test_case)
			{
				std::string body;
				const char* body_raw_ptr   = NULL;
				glw::GLint  compile_status = GL_FALSE;

				body = getShaderBody(static_cast<Utils::_shader_stage>(shader_stage), n_subroutine_types,
									 static_cast<_test_case>(test_case));
				body_raw_ptr = body.c_str();

				/* Try to compile the shader */
				m_so_id = gl.createShader(shader_type);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

				gl.shaderSource(m_so_id, 1 /* count */, &body_raw_ptr, DE_NULL);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

				gl.compileShader(m_so_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

				gl.getShaderiv(m_so_id, GL_COMPILE_STATUS, &compile_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

				if (compile_status == GL_TRUE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A malformed "
									   << Utils::getShaderStageString(static_cast<Utils::_shader_stage>(shader_stage))
									   << " compiled successfully "
										  "("
									   << n_subroutine_types << " subroutine types "
																"were defined)."
									   << tcu::TestLog::EndMessage;

					m_has_test_passed = false;
				}

				/* Release the object */
				gl.deleteShader(m_so_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");
			} /* for (all test cases) */
		}	 /* for (a number of different subroutine type declarations) */
	}		  /* for (all shader stages) */

	/* Done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}